

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O2

void * mpp_dec_parser_thread(void *data)

{
  MppBufferGroup *group;
  int *piVar1;
  HalTaskInfo *task_00;
  MppDecImpl *dec;
  MppThread *this;
  MppBufSlots slots;
  MppDecImpl *pMVar2;
  MppThread *pMVar3;
  MppBufSlots pvVar4;
  HalTaskGroup pvVar5;
  MppBufSlots pvVar6;
  MppPort port;
  list_head *plVar7;
  undefined4 index;
  ushort uVar8;
  undefined2 uVar9;
  MppThreadStatus MVar10;
  MPP_RET MVar11;
  uint uVar12;
  RK_S32 RVar13;
  RK_U32 RVar14;
  RK_U32 RVar15;
  MppFrameFormat MVar16;
  MppBuffer pvVar17;
  RK_S64 RVar18;
  size_t sVar19;
  void *pvVar20;
  list_head *plVar21;
  list_head *plVar22;
  DecTaskStatus DVar23;
  int iVar24;
  long lVar25;
  MppBufferGroup group_00;
  size_t in_stack_fffffffffffffe68;
  AutoMutex autolock;
  MppBuffer hal_buf_in;
  MppPacket local_158;
  MppBuffer hal_buf_out;
  DecTask task;
  
  dec = *(MppDecImpl **)((long)data + 0xa8);
  this = dec->thread_parser;
  slots = dec->packet_slots;
  dec_task_init(&task);
  mpp_clock_start(dec->clocks[0]);
  group = (MppBufferGroup *)((long)data + 0x40);
  do {
    while( true ) {
      while( true ) {
        autolock.mEnabled = 1;
        autolock.mLock = &this->mMutexCond[0].mLock;
        pthread_mutex_lock((pthread_mutex_t *)this->mMutexCond);
        MVar10 = MppThread::get_status(this,THREAD_WORK);
        if (MVar10 != MPP_THREAD_RUNNING) {
          Mutex::Autolock::~Autolock(&autolock);
          mpp_clock_pause(dec->clocks[0]);
          if (((byte)mpp_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread is going to exit\n",(char *)0x0);
          }
          if ((task.hnd != (HalTaskHnd)0x0) && (task.info.dec.valid != 0)) {
            mpp_buf_slot_set_flag(slots,task.info.dec.input,SLOT_CODEC_READY);
            mpp_buf_slot_set_flag(slots,task.info.dec.input,SLOT_HAL_INPUT);
            mpp_buf_slot_clr_flag(slots,task.info.dec.input,SLOT_HAL_INPUT);
          }
          mpp_buffer_group_clear(*(MppBufferGroup *)((long)data + 0x38));
          dec_release_task_in_port(*(MppPort *)((long)data + 0x60));
          if (((byte)mpp_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread exited\n",(char *)0x0);
          }
          return (void *)0x0;
        }
        MVar11 = check_task_wait(dec,&task);
        if (MVar11 != MPP_OK) {
          mpp_clock_start(dec->clocks[1]);
          MppThread::wait(this,(void *)0x0);
          mpp_clock_pause(dec->clocks[1]);
        }
        Mutex::Autolock::~Autolock(&autolock);
        if (dec->cmd_send == dec->cmd_recv) break;
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_parser_thread",
                     (ulong)dec->cmd_recv,(ulong)dec->cmd);
        }
        sem_wait((sem_t *)&dec->cmd_start);
        MVar11 = mpp_dec_proc_cfg(dec,dec->cmd,dec->param);
        *dec->cmd_ret = MVar11;
        uVar12 = dec->cmd_recv + 1;
        dec->cmd_recv = uVar12;
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_parser_thread",(ulong)uVar12
                     ,(ulong)dec->cmd_send);
        }
        dec->cmd = 0;
        dec->param = (void *)0x0;
        dec->cmd_ret = (MPP_RET *)0x0;
        sem_post((sem_t *)&dec->cmd_done);
      }
      if (dec->reset_flag == 0) break;
      pMVar2 = *(MppDecImpl **)((long)data + 0xa8);
      pMVar3 = pMVar2->thread_hal;
      pvVar4 = pMVar2->frame_slots;
      pvVar5 = pMVar2->tasks;
      pvVar6 = pMVar2->packet_slots;
      if ((((byte)mpp_dec_debug & 0x40) != 0) &&
         (_mpp_log_l(4,"mpp_dec","reset: parser reset start\n",(char *)0x0),
         ((byte)mpp_dec_debug & 0x40) != 0)) {
        _mpp_log_l(4,"mpp_dec","reset: parser wait hal proc reset start\n",(char *)0x0);
      }
      dec_release_task_in_port(*(MppPort *)((long)data + 0x60));
      if (pMVar3 == (MppThread *)0x0) {
        in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x94);
        _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                   "reset_parser_thread",in_stack_fffffffffffffe68);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
      }
      pthread_mutex_lock((pthread_mutex_t *)pMVar3->mMutexCond);
      pMVar2->hal_reset_post = pMVar2->hal_reset_post + 1;
      pthread_cond_signal((pthread_cond_t *)&pMVar3->mMutexCond[0].mCondition);
      pthread_mutex_unlock((pthread_mutex_t *)pMVar3->mMutexCond);
      sem_wait((sem_t *)&pMVar2->hal_reset);
      if (((byte)mpp_dec_debug & 0x40) != 0) {
        _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty start\n",(char *)0x0);
      }
      MVar11 = hal_task_check_empty(pvVar5,1);
      if ((MVar11 != MPP_OK) &&
         (_mpp_log_l(2,"mpp_dec","found task not processed put %d get %d\n","reset_parser_thread",
                     (ulong)*(uint *)((long)data + 0x30),(ulong)*(uint *)((long)data + 0x34)),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00146b55;
      if (((byte)mpp_dec_debug & 0x40) != 0) {
        _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty done\n",(char *)0x0);
      }
      task.status.val = task.status.val & 0xfffffebf | 0x40;
      task.info.dec.valid = 0;
      mpp_parser_reset(pMVar2->parser);
      mpp_hal_reset(pMVar2->hal);
      pvVar20 = pMVar2->vproc;
      iVar24 = 1;
      if (pvVar20 != (void *)0x0) {
        if (((byte)mpp_dec_debug & 0x40) != 0) {
          _mpp_log_l(4,"mpp_dec","reset: vproc reset start\n",(char *)0x0);
          pvVar20 = pMVar2->vproc;
        }
        dec_vproc_reset(pvVar20);
        if (((byte)mpp_dec_debug & 0x40) != 0) {
          _mpp_log_l(4,"mpp_dec","reset: vproc reset done\n",(char *)0x0);
        }
      }
      if ((task.status.val & 0x200) != 0) {
        _mpp_log_l(4,"mpp_dec","task no send to hal que must clr current frame hal status\n",
                   (char *)0x0);
        if (-1 < task.info.dec.output) {
          mpp_buf_slot_clr_flag(pvVar4,task.info.dec.output,SLOT_HAL_OUTPUT);
        }
        for (lVar25 = 0; lVar25 != 0x11; lVar25 = lVar25 + 1) {
          iVar24 = *(int *)((long)&task.info + lVar25 * 4 + 0x38);
          if (-1 < iVar24) {
            mpp_buf_slot_clr_flag(pvVar4,iVar24,SLOT_HAL_INPUT);
          }
        }
        local_158 = (MppPacket)CONCAT44(local_158._4_4_,iVar24);
        task.status.val = task.status.val & 0xfffffdff;
      }
      dec_release_input_packet(pMVar2,1);
      while (MVar11 = mpp_buf_slot_dequeue(pvVar4,(RK_S32 *)&local_158,QUEUE_DISPLAY),
            MVar11 == MPP_OK) {
        autolock.mEnabled = 0;
        autolock._4_4_ = 0;
        mpp_buf_slot_get_prop(pvVar4,(RK_S32)local_158,SLOT_BUFFER,&autolock);
        if (autolock._0_8_ != 0) {
          mpp_buffer_put_with_caller((MppBuffer)autolock._0_8_,"reset_parser_thread");
        }
        mpp_buf_slot_clr_flag(pvVar4,(RK_S32)local_158,SLOT_QUEUE_USE);
      }
      if ((pMVar2->cfg).base.sort_pts != 0) {
        mpp_spinlock_lock(&pMVar2->ts_lock);
        plVar21 = (pMVar2->ts_link).next;
        while (plVar21 != &pMVar2->ts_link) {
          plVar22 = plVar21->next;
          plVar7 = plVar21->prev;
          plVar22->prev = plVar7;
          plVar7->next = plVar22;
          plVar21->next = plVar21;
          plVar21->prev = plVar21;
          mpp_mem_pool_put_f("reset_parser_thread",pMVar2->ts_pool,plVar21);
          plVar21 = plVar22;
        }
        mpp_spinlock_unlock(&pMVar2->ts_lock);
      }
      uVar9 = task.status.val._0_2_;
      if ((task.status.val & 0x20) != 0) {
        mpp_buf_slot_clr_flag(pvVar6,task.info.dec.input,SLOT_HAL_INPUT);
        uVar9 = task.status.val._0_2_ & 0xffdf;
        task.status.val = task.status.val & 0xffffffdf;
        task.info.dec.input = -1;
      }
      if ((task.wait.val & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","reset at info change\n",(char *)0x0);
        uVar9 = task.status.val._0_2_;
      }
      task.status.val = CONCAT22(task.status.val._2_2_,uVar9) & 0xfffffdff;
      pMVar2->parser_status_flag = 0;
      pMVar2->parser_wait_flag = 0;
      dec_task_init(&task);
      if (((byte)mpp_dec_debug & 0x40) != 0) {
        _mpp_log_l(4,"mpp_dec","reset: parser reset all done\n",(char *)0x0);
      }
      autolock.mEnabled = 1;
      autolock.mLock = (Mutex *)(this->mMutexCond + 3);
      pthread_mutex_lock((pthread_mutex_t *)(this->mMutexCond + 3));
      dec->reset_flag = 0;
      sem_post((sem_t *)&dec->parser_reset);
      Mutex::Autolock::~Autolock(&autolock);
    }
    mpp_clock_start(dec->clocks[2]);
    pMVar2 = *(MppDecImpl **)((long)data + 0xa8);
    pvVar5 = pMVar2->tasks;
    pvVar4 = pMVar2->frame_slots;
    pvVar6 = pMVar2->packet_slots;
    hal_buf_in = (MppBuffer)0x0;
    hal_buf_out = (MppBuffer)0x0;
    if (task.hnd == (HalTaskHnd)0x0) {
      hal_task_get_hnd(pvVar5,0,&task.hnd);
      if (task.hnd != (HalTaskHnd)0x0) {
        task.wait.val = task.wait.val & 0xfffffeff;
        goto LAB_00145bbe;
      }
      task.wait.val = task.wait.val | 0x100;
    }
    else {
LAB_00145bbe:
      if ((pMVar2->mpp_pkt_in == (MppPacket)0x0) && ((task.status.val & 0x100) == 0)) {
        port = *(MppPort *)((long)data + 0x60);
        lVar25 = *(long *)((long)data + 0xa8);
        autolock.mEnabled = 0;
        autolock._4_4_ = 0;
        local_158 = (MppPacket)0x0;
        MVar11 = _mpp_port_poll("try_get_input_packet",port,MPP_POLL_NON_BLOCK);
        if (MVar11 < MPP_OK) {
          task.wait.val = task.wait.val | 1;
          goto LAB_00146a5d;
        }
        MVar11 = _mpp_port_dequeue("try_get_input_packet",port,(MppTask *)&autolock);
        if (MVar11 != MPP_OK || autolock._0_8_ == 0) {
          in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x12a);
          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ret == MPP_OK && mpp_task","try_get_input_packet",in_stack_fffffffffffffe68);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
        }
        mpp_task_meta_get_packet((MppTask)autolock._0_8_,KEY_INPUT_PACKET,&local_158);
        if (local_158 == (MppPacket)0x0) {
          in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),300);
          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"packet",
                     "try_get_input_packet",in_stack_fffffffffffffe68);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
        }
        pvVar17 = mpp_packet_get_buffer(local_158);
        if (pvVar17 == (MppBuffer)0x0) {
          _mpp_port_enqueue("try_get_input_packet",port,(MppTask)autolock._0_8_);
        }
        *(MppPacket *)(lVar25 + 0x208) = local_158;
        *(int *)((long)data + 0x24) = *(int *)((long)data + 0x24) + 1;
        piVar1 = (int *)(lVar25 + 0x280);
        *piVar1 = *piVar1 + 1;
        task.status.val = task.status.val | 2;
        task.wait.val = task.wait.val & 0xfffffffe;
        if (pMVar2->mpp_pkt_in == (MppPacket)0x0) {
          in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x15c);
          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"dec->mpp_pkt_in",
                     "try_proc_dec_task",in_stack_fffffffffffffe68);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
        }
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          RVar18 = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
          in_stack_fffffffffffffe68 = mpp_packet_get_length(pMVar2->mpp_pkt_in);
          _mpp_log_l(4,"mpp_dec","detail: %p get pkt pts %llu len %d\n","try_proc_dec_task",pMVar2,
                     RVar18,in_stack_fffffffffffffe68);
        }
      }
      DVar23 = task.status;
      if ((task.status.val >> 8 & 1) == 0) {
        if (((byte)mpp_debug & 2) != 0) {
          RVar18 = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
          _mpp_log_l(4,"mpp_dec","input packet pts %lld\n",(char *)0x0,RVar18);
        }
        mpp_clock_start(pMVar2->clocks[3]);
        mpp_parser_prepare(pMVar2->parser,pMVar2->mpp_pkt_in,&task.info.dec);
        mpp_clock_pause(pMVar2->clocks[3]);
        if (((pMVar2->cfg).base.sort_pts != 0) && (task.info.dec.valid != 0)) {
          task.ts_cur.pts = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
          task.ts_cur.dts = mpp_packet_get_dts(pMVar2->mpp_pkt_in);
        }
        dec_release_input_packet(pMVar2,0);
        DVar23.val = task.status.val & 0xffff;
      }
      uVar8 = (ushort)((task.info.dec.valid & 1) << 8);
      task.status.val._0_2_ = (ushort)DVar23.val & 0xfeff | uVar8;
      if ((task.info.dec.valid == 0 & task.info._8_1_) == 1) {
        mpp_dec_put_task((Mpp *)data,&task);
        uVar8 = (ushort)task.status.val & 0x100;
      }
      if (uVar8 != 0) {
        if (task.info.dec.input_packet == (MppPacket)0x0) {
          in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x196);
          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "task_dec->input_packet","try_proc_dec_task",in_stack_fffffffffffffe68);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
        }
        if (task.info.dec.input < 0) {
          mpp_buf_slot_get_unused(pvVar6,&task.info.dec.input);
        }
        task.wait.val._0_2_ =
             (ushort)task.wait.val & 0xefff | (ushort)((uint)task.info._44_4_ >> 0x13) & 0x1000;
        if (-1 < task.info.dec.input) {
          sVar19 = mpp_packet_get_size(task.info.dec.input_packet);
          mpp_buf_slot_get_prop(pvVar6,task.info.dec.input,SLOT_BUFFER,&hal_buf_in);
          if (hal_buf_in == (MppBuffer)0x0) {
            mpp_buffer_get_with_tag
                      (*(MppBufferGroup *)((long)data + 0x38),&hal_buf_in,sVar19,"mpp_dec",
                       "try_proc_dec_task");
            if (hal_buf_in == (MppBuffer)0x0) {
              task.wait.val = task.wait.val | 0x2000;
              goto LAB_00146a5d;
            }
            mpp_buf_slot_set_prop(pvVar6,task.info.dec.input,SLOT_BUFFER,hal_buf_in);
            mpp_buffer_attach_dev_f("try_proc_dec_task",hal_buf_in,pMVar2->dev);
            mpp_buffer_put_with_caller(hal_buf_in,"try_proc_dec_task");
          }
          else if (*(ulong *)((long)hal_buf_in + 0x88) < sVar19) {
            in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x1b2);
            _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "buf->info.size >= stream_size","try_proc_dec_task",in_stack_fffffffffffffe68
                      );
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
          }
          task.wait.val._0_2_ =
               (ushort)task.wait.val & 0xdfff | (ushort)(hal_buf_in == (MppBuffer)0x0) << 0xd;
          if (hal_buf_in != (MppBuffer)0x0) {
            uVar12 = task.status.val & 0xffff;
            if ((task.status.val & 0x20) == 0) {
              pvVar20 = mpp_packet_get_data(task.info.dec.input_packet);
              sVar19 = mpp_packet_get_length(task.info.dec.input_packet);
              mpp_buffer_write_with_caller(hal_buf_in,0,pvVar20,sVar19,"try_proc_dec_task");
              mpp_buffer_sync_partial_end_f(hal_buf_in,0,0,(RK_U32)sVar19,"try_proc_dec_task");
              mpp_buf_slot_set_flag(pvVar6,task.info.dec.input,SLOT_CODEC_READY);
              mpp_buf_slot_set_flag(pvVar6,task.info.dec.input,SLOT_HAL_INPUT);
              uVar12 = task.status.val | 0x20;
              task.status.val._0_2_ = (short)uVar12;
            }
            if ((pMVar2->parser_fast_mode == 0) && ((uVar12 & 0x40) == 0)) {
              autolock.mEnabled = 0;
              autolock._4_4_ = 0;
              hal_task_get_hnd(pvVar5,2,(HalTaskHnd *)&autolock);
              if (autolock._0_8_ == 0) {
                task.wait.val = task.wait.val | 0x200;
                goto LAB_00146a5d;
              }
              task.status.val = task.status.val | 0x40;
              task.wait.val = task.wait.val & 0xfffffdff;
              hal_task_hnd_set_status((HalTaskHnd)autolock._0_8_,0);
            }
            if ((task.wait.val & 0x80) != 0) {
              MVar11 = hal_task_check_empty(pMVar2->tasks,1);
              if (MVar11 != MPP_OK) goto LAB_00146a5d;
              task.wait.val = task.wait.val & 0xffffff7f;
            }
            if (((byte)mpp_dec_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_dec","detail: %p check prev task pass\n","try_proc_dec_task",pMVar2)
              ;
            }
            if (*(mpp_list **)((long)data + 0x18) != (mpp_list *)0x0) {
              RVar13 = mpp_list::list_size(*(mpp_list **)((long)data + 0x18));
              task.wait.val._0_2_ = ((ushort)task.wait.val & 0xfffd) + (ushort)(4 < RVar13) * 2;
              if (4 < RVar13) goto LAB_00146a5d;
            }
            if (((byte)mpp_dec_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_dec","detail: %p check mframes pass\n","try_proc_dec_task",pMVar2);
            }
            RVar13 = mpp_slots_get_unused_count(pvVar4);
            task.wait.val._0_2_ = (ushort)task.wait.val & 0xbfff | (ushort)(RVar13 == 0) << 0xe;
            if (RVar13 != 0) {
              if ((task.status.val & 0x200) == 0) {
                mpp_clock_start(pMVar2->clocks[4]);
                mpp_parser_parse(pMVar2->parser,&task.info.dec);
                mpp_clock_pause(pMVar2->clocks[4]);
                task.status.val = task.status.val | 0x200;
              }
              if ((task.info.dec.output < 0) || (task.info.dec.valid == 0)) {
                if (((ulong)task.info.dec.flags & 1) == 0) {
                  hal_task_hnd_set_status(task.hnd,0);
                  task.hnd = (HalTaskHnd)0x0;
                }
                else {
                  mpp_dec_put_task((Mpp *)data,&task);
                }
                uVar9 = task.status.val._0_2_;
                if ((task.status.val & 0x20) != 0) {
                  mpp_buf_slot_clr_flag(pvVar6,task.info.dec.input,SLOT_HAL_INPUT);
                  uVar9 = task.status.val._0_2_ & 0xffdf;
                }
                task.status.val = CONCAT22(task.status.val._2_2_,uVar9) & 0xfffffcff;
                dec_task_info_init(&task.info);
              }
              else {
                if (((byte)mpp_dec_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_dec","detail: %p check output index pass\n","try_proc_dec_task",
                             pMVar2);
                }
                RVar14 = mpp_buf_slot_is_changed(pvVar4);
                if (RVar14 != 0) {
                  if ((task.status.val & 0x80) == 0) {
                    uVar12 = task.info._8_4_;
                    task.info.dec.flags =
                         (HalDecTaskFlag)((ulong)task.info.dec.flags & 0xfffffffffffffffc | 2);
                    mpp_dec_put_task((Mpp *)data,&task);
                    task.info.dec.flags =
                         (HalDecTaskFlag)
                         ((ulong)task.info.dec.flags & 0xfffffffffffffffe | (ulong)(uVar12 & 1));
                    task.status.val = task.status.val | 0x80;
                    goto LAB_00146a5d;
                  }
                  pMVar2->info_updated = 0;
                }
                RVar14 = mpp_buf_slot_is_changed(pvVar4);
                task.wait.val._0_2_ = (ushort)task.wait.val & 0xffdf | (ushort)((RVar14 & 1) << 5);
                if ((RVar14 & 1) == 0) {
                  task.status.val = task.status.val & 0xffffff7f;
                  task.info._8_8_ = task.info._8_8_ & 0xfffffffffffffffd;
                  if (task.hnd == (HalTaskHnd)0x0) {
                    in_stack_fffffffffffffe68 =
                         CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x23a);
                    _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"task->hnd",
                               "try_proc_dec_task",in_stack_fffffffffffffe68);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00146b55;
                  }
                  group_00 = *group;
                  if (group_00 == (MppBufferGroup)0x0) {
                    _mpp_log_l(4,"mpp_dec","mpp_dec use internal frame buffer group\n",(char *)0x0);
                    mpp_buffer_group_get
                              (group,0x20001,MPP_BUFFER_INTERNAL,"mpp_dec","try_proc_dec_task");
                    group_00 = *group;
                    if (group_00 != (MppBufferGroup)0x0) goto LAB_00146663;
                  }
                  else {
LAB_00146663:
                    RVar13 = mpp_buffer_group_unused(group_00);
                    iVar24 = (uint)(pMVar2->vproc != (void *)0x0) * 2 + 1;
                    task.wait.val._0_2_ =
                         (ushort)task.wait.val & 0xffbf | (ushort)(RVar13 < iVar24) << 6;
                    if (RVar13 < iVar24) goto LAB_00146a5d;
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check frame group count pass\n",
                               "try_proc_dec_task",pMVar2);
                  }
                  index = task.info.dec.output;
                  mpp_buf_slot_get_prop(pvVar4,task.info.dec.output,SLOT_BUFFER,&hal_buf_out);
                  if (hal_buf_out == (MppBuffer)0x0) {
                    autolock.mEnabled = 0;
                    autolock._4_4_ = 0;
                    mpp_buf_slot_get_prop(pvVar4,index,SLOT_FRAME_PTR,&autolock);
                    sVar19 = mpp_buf_slot_get_size(pvVar4);
                    if ((autolock._0_8_ != 0) &&
                       (RVar14 = mpp_frame_get_thumbnail_en((MppFrame)autolock._0_8_), RVar14 == 2))
                    {
                      RVar14 = mpp_frame_get_width((MppFrame)autolock._0_8_);
                      RVar15 = mpp_frame_get_height((MppFrame)autolock._0_8_);
                      sVar19 = (size_t)((RVar15 >> 1) * (RVar14 >> 1) * 3 >> 1);
                    }
                    mpp_buffer_get_with_tag
                              (*group,&hal_buf_out,sVar19,"mpp_dec","try_proc_dec_task");
                    if (hal_buf_out != (MppBuffer)0x0) {
                      mpp_buf_slot_set_prop(pvVar4,index,SLOT_BUFFER,hal_buf_out);
                    }
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check output buffer %p\n","try_proc_dec_task"
                               ,pMVar2,hal_buf_out);
                  }
                  autolock.mEnabled = 0;
                  autolock._4_4_ = 0;
                  mpp_buf_slot_get_prop(pvVar4,index,SLOT_FRAME_PTR,&autolock);
                  MVar16 = mpp_frame_get_fmt((MppFrame)autolock._0_8_);
                  if (((MVar16 & 0xc000000) != MPP_FMT_YUV420SP) &&
                     ((pMVar2->cfg).base.enable_hdr_meta != 0)) {
                    fill_hdr_meta_to_frame((MppFrame)autolock._0_8_,pMVar2->coding);
                  }
                  if ((pMVar2->info_updated == 0) && (pMVar2->dev != (MppDev)0x0)) {
                    autolock.mEnabled = 0;
                    autolock._4_4_ = 0;
                    mpp_buf_slot_get_prop(pvVar4,index,SLOT_FRAME_PTR,&autolock);
                    update_dec_hal_info(pMVar2,(MppFrame)autolock._0_8_);
                    pMVar2->info_updated = 1;
                  }
                  task.wait.val._0_2_ =
                       (ushort)task.wait.val & 0xfbff |
                       (ushort)(hal_buf_out == (MppBuffer)0x0) << 10;
                  if (hal_buf_out != (MppBuffer)0x0) {
                    if ((pMVar2->cfg).base.sort_pts != 0) {
                      autolock.mEnabled = 0;
                      autolock._4_4_ = 0;
                      plVar21 = (list_head *)mpp_mem_pool_get_f("try_proc_dec_task",pMVar2->ts_pool)
                      ;
                      if (plVar21 == (list_head *)0x0) {
                        in_stack_fffffffffffffe68 =
                             CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x28d);
                        _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt_ts"
                                   ,"try_proc_dec_task",in_stack_fffffffffffffe68);
                        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00146b55:
                          abort();
                        }
                      }
                      mpp_buf_slot_get_prop(pvVar4,index,SLOT_FRAME_PTR,&autolock);
                      plVar21[1].next = (list_head *)task.ts_cur.pts;
                      plVar21[1].prev = (list_head *)task.ts_cur.dts;
                      plVar21->next = plVar21;
                      plVar21->prev = plVar21;
                      if ((autolock._0_8_ != 0) &&
                         (plVar22 = (list_head *)mpp_frame_get_pts((MppFrame)autolock._0_8_),
                         plVar22 == plVar21[1].next)) {
                        mpp_spinlock_lock(&pMVar2->ts_lock);
                        plVar22 = (pMVar2->ts_link).prev;
                        (pMVar2->ts_link).prev = plVar21;
                        plVar21->next = &pMVar2->ts_link;
                        plVar21->prev = plVar22;
                        plVar22->next = plVar21;
                        list_sort((void *)0x0,&pMVar2->ts_link,ts_cmp);
                        mpp_spinlock_unlock(&pMVar2->ts_lock);
                      }
                    }
                    mpp_clock_start(pMVar2->clocks[5]);
                    task_00 = &task.info;
                    mpp_hal_reg_gen(pMVar2->hal,task_00);
                    mpp_clock_pause(pMVar2->clocks[5]);
                    mpp_clock_start(pMVar2->clocks[6]);
                    mpp_hal_hw_start(pMVar2->hal,task_00);
                    mpp_clock_pause(pMVar2->clocks[6]);
                    mpp_dec_put_task((Mpp *)data,&task);
                    uVar8 = (ushort)((task.info._8_4_ & 0x20) << 2);
                    if (pMVar2->parser_fast_mode == 0) {
                      uVar8 = 0;
                    }
                    task.wait.val._0_2_ = (ushort)task.wait.val & 0xff7f | uVar8;
                    task.status.val = task.status.val & 0xfffffc9f;
                    dec_task_info_init(task_00);
                    if (((byte)mpp_dec_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_dec","detail: %p one task ready\n","try_proc_dec_task",
                                 pMVar2);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00146a5d:
    mpp_clock_pause(dec->clocks[2]);
  } while( true );
}

Assistant:

void *mpp_dec_parser_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *parser = dec->thread_parser;
    MppBufSlots packet_slots = dec->packet_slots;

    DecTask task;
    HalDecTask  *task_dec = &task.info.dec;

    dec_task_init(&task);

    mpp_clock_start(dec->clocks[DEC_PRS_TOTAL]);

    while (1) {
        {
            AutoMutex autolock(parser->mutex());
            if (MPP_THREAD_RUNNING != parser->get_status())
                break;

            /*
             * parser thread need to wait at cases below:
             * 1. no task slot for output
             * 2. no packet for parsing
             * 3. info change on progress
             * 3. no buffer on analyzing output task
             */
            if (check_task_wait(dec, &task)) {
                mpp_clock_start(dec->clocks[DEC_PRS_WAIT]);
                parser->wait();
                mpp_clock_pause(dec->clocks[DEC_PRS_WAIT]);
            }
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        if (dec->reset_flag) {
            reset_parser_thread(mpp, &task);

            AutoMutex autolock(parser->mutex(THREAD_CONTROL));
            dec->reset_flag = 0;
            sem_post(&dec->parser_reset);
            continue;
        }

        // NOTE: ignore return value here is to fast response to reset.
        // Otherwise we can loop all dec task until it is failed.
        mpp_clock_start(dec->clocks[DEC_PRS_PROC]);
        try_proc_dec_task(mpp, &task);
        mpp_clock_pause(dec->clocks[DEC_PRS_PROC]);
    }

    mpp_clock_pause(dec->clocks[DEC_PRS_TOTAL]);

    mpp_dbg_info("mpp_dec_parser_thread is going to exit\n");
    if (task.hnd && task_dec->valid) {
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
        mpp_buf_slot_clr_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
    }
    mpp_buffer_group_clear(mpp->mPacketGroup);
    dec_release_task_in_port(mpp->mMppInPort);
    mpp_dbg_info("mpp_dec_parser_thread exited\n");
    return NULL;
}